

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::ActionBuf::serialize(ActionBuf *this,A2A *a2a)

{
  int x;
  int x_00;
  int x_01;
  pointer pAVar1;
  unsigned_long x_02;
  unsigned_long x_03;
  unsigned_long x_04;
  unsigned_long x_05;
  ulong uVar2;
  int p;
  int iVar3;
  long lVar4;
  
  for (lVar4 = 0; iVar3 = (int)lVar4, lVar4 < a2a->m_nprocs; lVar4 = lVar4 + 1) {
    serial<unsigned_int>(a2a,iVar3,this->m_dummy_bsmp);
    serial<unsigned_long>
              (a2a,iVar3,
               (this->m_get_buffer_offset).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4]);
    serial<unsigned_long>
              (a2a,iVar3,
               (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar4]);
  }
  lVar4 = 0;
  uVar2 = 0;
  while( true ) {
    pAVar1 = (this->m_actions).
             super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_actions).
                       super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x38) <= uVar2)
    break;
    iVar3 = *(int *)((long)&pAVar1->target_pid + lVar4);
    x = *(int *)((long)&pAVar1->src_pid + lVar4);
    x_00 = *(int *)((long)&pAVar1->dst_pid + lVar4);
    x_01 = *(int *)((long)&pAVar1->tag + lVar4);
    x_02 = *(unsigned_long *)((long)&pAVar1->src_slot + lVar4);
    x_03 = *(unsigned_long *)((long)&pAVar1->dst_slot + lVar4);
    x_04 = *(unsigned_long *)((long)&pAVar1->offset + lVar4);
    x_05 = *(unsigned_long *)((long)&pAVar1->size + lVar4);
    serial<unsigned_int>(a2a,iVar3,*(uint *)((long)&pAVar1->kind + lVar4));
    serial<int>(a2a,iVar3,x);
    serial<int>(a2a,iVar3,x_00);
    serial<int>(a2a,iVar3,x_01);
    serial<unsigned_long>(a2a,iVar3,x_02);
    serial<unsigned_long>(a2a,iVar3,x_03);
    serial<unsigned_long>(a2a,iVar3,x_04);
    serial<unsigned_long>(a2a,iVar3,x_05);
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + 0x38;
  }
  return;
}

Assistant:

void Rdma::ActionBuf::serialize( A2A & a2a ) 
{
    for (int p = 0; p < a2a.nprocs(); ++p ) {
        serial( a2a, p, m_dummy_bsmp );
        serial( a2a, p, m_get_buffer_offset[ p ] );
        serial( a2a, p, m_counts[ p ] );
    }

    for (size_t i = 0; i < m_actions.size(); ++i ) 
    {
        Action a = m_actions[i];
#ifdef PROFILE
        TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
        size_t start = a2a.send_size(a.target_pid);
#endif
        serial( a2a, a.target_pid, unsigned(a.kind) );
        serial( a2a, a.target_pid, a.src_pid );
        serial( a2a, a.target_pid, a.dst_pid );
        serial( a2a, a.target_pid, a.tag );
        serial( a2a, a.target_pid, a.src_slot );
        serial( a2a, a.target_pid, a.dst_slot );
        serial( a2a, a.target_pid, a.offset );
        serial( a2a, a.target_pid, a.size );
#ifdef PROFILE
        size_t end = a2a.send_size(a.target_pid);
        t.add_bytes(end-start);
#endif
    }
}